

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  char *pcVar1;
  undefined8 uStack_20;
  
  if (tcp == (uv_stream_t *)0x0) {
    pcVar1 = "tcp != NULL";
    uStack_20 = 0x55;
LAB_0015c3ab:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,uStack_20,pcVar1);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      pcVar1 = "nread == UV_EOF";
      uStack_20 = 0x5b;
      goto LAB_0015c3ab;
    }
    puts("GOT EOF");
    uv_close(tcp,close_cb);
  }
  else {
    bytes_received_done = bytes_received_done + nread;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(tcp != NULL);

  if (nread >= 0) {
    ASSERT(nread == 4);
    ASSERT(memcmp("PING", buf->base, nread) == 0);
  }
  else {
    ASSERT(nread == UV_EOF);
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}